

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O3

int __thiscall
capnp::TwoPartyVatNetwork::accept
          (TwoPartyVatNetwork *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined8 *puVar1;
  long *plVar2;
  Connection *pCVar3;
  WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
  *params;
  undefined4 in_register_00000034;
  long lVar4;
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  local_60;
  _func_int **local_50;
  WeakFulfillerBase *local_48;
  undefined8 local_40;
  _func_int **local_38;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  if ((*(short *)(lVar4 + 0x34) == 0) && (*(char *)(lVar4 + 0x138) == '\0')) {
    *(undefined1 *)(lVar4 + 0x138) = 1;
    local_60.disposer = (Disposer *)(lVar4 + 0x348);
    *(int *)(lVar4 + 0x360) = *(int *)(lVar4 + 0x360) + 1;
    local_60.ptr = (Connection *)(lVar4 + 8);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>
              ((PromiseDisposer *)this,&local_60);
    pCVar3 = local_60.ptr;
    if (local_60.ptr != (Connection *)0x0) {
      local_60.ptr = (Connection *)0x0;
      (**(local_60.disposer)->_vptr_Disposer)
                (local_60.disposer,
                 (pCVar3->super_Connection)._vptr_Connection[-2] +
                 (long)&(pCVar3->super_Connection)._vptr_Connection);
    }
  }
  else {
    params = (WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
              *)operator_new(0x18);
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->
    super_PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
    ).super_PromiseRejector._vptr_PromiseRejector = (_func_int **)&PTR_reject_006d1640;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_006d1678;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>,kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>&>
              ((PromiseDisposer *)&local_38,params);
    local_50 = local_38;
    puVar1 = *(undefined8 **)(lVar4 + 0x2f0);
    plVar2 = *(long **)(lVar4 + 0x2f8);
    *(WeakFulfillerBase **)(lVar4 + 0x2f0) = &params->super_WeakFulfillerBase;
    *(WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
      **)(lVar4 + 0x2f8) = params;
    local_40 = 0;
    if (plVar2 != (long *)0x0) {
      local_48 = &params->super_WeakFulfillerBase;
      (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    (this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase = local_38;
  }
  return (int)this;
}

Assistant:

kj::Promise<kj::Own<TwoPartyVatNetworkBase::Connection>> TwoPartyVatNetwork::accept() {
  if (side == rpc::twoparty::Side::SERVER && !accepted) {
    accepted = true;
    return asConnection();
  } else {
    // Create a promise that will never be fulfilled.
    auto paf = kj::newPromiseAndFulfiller<kj::Own<TwoPartyVatNetworkBase::Connection>>();
    acceptFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}